

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::ConcatTransform(ParsedScene *this,Float *tr,FileLoc loc)

{
  span<const_float> t;
  Transform *pTVar1;
  span<const_float> *in_RDI;
  int i;
  size_t in_stack_fffffffffffffde8;
  span<float> *v;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  TransformSet *in_stack_fffffffffffffe28;
  FileLoc *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  Transform *in_stack_fffffffffffffe70;
  Transform *in_stack_fffffffffffffe78;
  Transform *in_stack_fffffffffffffe80;
  SquareMatrix<4> *in_stack_fffffffffffffe88;
  Transform *in_stack_fffffffffffffe90;
  undefined1 local_94 [128];
  int local_14;
  
  v = (span<float> *)&stack0x00000008;
  if (*(int *)&in_RDI[0x86].ptr == 2) {
    Error<char_const(&)[16]>
              (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
               (char (*) [16])CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  }
  else {
    for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
      if ((*(uint *)((long)&in_RDI[0x96].ptr + 4) & 1 << ((byte)local_14 & 0x1f)) != 0) {
        pTVar1 = TransformSet::operator[](in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
        pstd::MakeSpan<float>((float *)pTVar1,in_stack_fffffffffffffde8);
        pstd::span<float_const>::span<pstd::span<float>,void,pstd::span<float>>(in_RDI,v);
        t.n = in_stack_fffffffffffffe38;
        t.ptr = (float *)in_stack_fffffffffffffe30;
        SquareMatrix<4>::SquareMatrix((SquareMatrix<4> *)in_stack_fffffffffffffe28,t);
        pbrt::Transform::Transform(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        Transpose(in_stack_fffffffffffffe70);
        pbrt::Transform::operator*(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        pTVar1 = TransformSet::operator[](in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
        memcpy(pTVar1,local_94,0x80);
      }
    }
  }
  return;
}

Assistant:

void ParsedScene::ConcatTransform(Float tr[16], FileLoc loc) {
    VERIFY_INITIALIZED("ConcatTransform");
    FOR_ACTIVE_TRANSFORMS(curTransform[i] =
                              curTransform[i] * Transpose(pbrt::Transform(SquareMatrix<4>(
                                                    pstd::MakeSpan(tr, 16))));)
}